

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O1

err_t cmdFileBehead(char *name,size_t count)

{
  err_t eVar1;
  bool_t bVar2;
  bool_t bVar3;
  file_t file;
  size_t sVar4;
  size_t sVar5;
  err_t eVar6;
  ulong size;
  bool bVar7;
  size_t c;
  size_t local_40;
  blob_t local_38;
  
  file = fileOpen(name,"r+b");
  if (file == (file_t)0x0) {
    return 0xcb;
  }
  sVar4 = fileSize(file);
  if (sVar4 == 0xffffffffffffffff || sVar4 < count) {
    eVar6 = 0xd1;
    if (count <= sVar4) {
      eVar6 = 0;
    }
    eVar1 = 0xcf;
    if (sVar4 != 0xffffffffffffffff) {
      eVar1 = eVar6;
    }
  }
  else {
    local_38 = blobCreate(0x1000);
    if (local_38 == (blob_t)0x0) {
      fileClose(file);
      return 0x6e;
    }
    size = sVar4 - count;
    if (size == 0) {
      eVar1 = 0;
      bVar7 = true;
    }
    else {
      sVar4 = 0;
      do {
        local_40 = size - sVar4;
        if (0xfff < local_40) {
          local_40 = 0x1000;
        }
        bVar2 = fileSeek(file,count + sVar4,0);
        eVar1 = 0xcf;
        if (((bVar2 != 0) && (sVar5 = fileRead2(local_38,local_40,file), sVar5 == local_40)) &&
           (bVar2 = fileSeek(file,sVar4,0), bVar2 != 0)) {
          eVar1 = fileWrite(&local_40,local_38,local_40,file);
        }
        bVar7 = eVar1 == 0;
        if (!bVar7) {
          blobClose(local_38);
          goto LAB_0010427a;
        }
        sVar4 = sVar4 + local_40;
      } while (sVar4 < size);
    }
    blobClose(local_38);
    if (bVar7) {
      bVar2 = fileTrunc(file,size);
      bVar3 = fileClose(file);
      if (bVar2 == 0) {
        return 0xce;
      }
      if (bVar3 == 0) {
        return 0x67;
      }
      return 0;
    }
  }
LAB_0010427a:
  fileClose(file);
  return eVar1;
}

Assistant:

err_t cmdFileBehead(const char* name, size_t count)
{
	const size_t buf_size = 4096;
	err_t code;
	file_t file;
	size_t size;
	size_t pos;
	void* buf;
	// pre
	ASSERT(strIsValid(name));
	// открыть файл
	code = cmdFileOpen(file, name, "r+b");
	ERR_CALL_CHECK(code);
	// определить размер файла
	if ((size = fileSize(file)) == SIZE_MAX)
		code = ERR_FILE_READ;
	else if (size < count)
		code = ERR_FILE_SIZE;
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// сдвинуть содержимое файла влево
	code = cmdBlobCreate(buf, buf_size);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	for (pos = 0; code == ERR_OK && pos < size - count;)
	{
		size_t c = MIN2(buf_size, size - count - pos);
		if (!fileSeek(file, pos + count, SEEK_SET) ||
			fileRead2(buf, c, file) != c ||
			!fileSeek(file, pos, SEEK_SET))
			code = ERR_FILE_READ;
		else
			code = fileWrite(&c, buf, c, file);
		pos += c;
	}
	cmdBlobClose(buf);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// обрезать файл
	if (!fileTrunc(file, size - count))
		code = ERR_FILE_WRITE;
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// завершить
	return cmdFileClose(file);
}